

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExclusiveTermAppender.h
# Opt level: O3

int32_t __thiscall
aeron::concurrent::logbuffer::ExclusiveTermAppender::appendUnfragmentedMessage
          (ExclusiveTermAppender *this,int32_t termId,int32_t termOffset,HeaderWriter *header,
          AtomicBuffer *srcBuffer,index_t srcOffset,index_t length,
          on_reserved_value_supplier_t *reservedValueSupplier)

{
  uint8_t *puVar1;
  length_t lVar2;
  AtomicBuffer *pAVar3;
  uint8_t *puVar4;
  index_t iVar5;
  AtomicBuffer *pAVar6;
  long lVar7;
  int32_t iVar8;
  size_t length_00;
  int32_t paddingLength;
  int iVar9;
  int64_t dummy;
  int32_t local_50 [2];
  index_t local_48;
  int local_44;
  ulong local_40;
  AtomicBuffer *local_38;
  
  local_40 = (ulong)(uint)termId;
  lVar2 = this->m_termBuffer->m_length;
  iVar8 = (length + 0x3fU & 0xffffffe0) + termOffset;
  *this->m_tailAddr = CONCAT44(termId,iVar8);
  if ((int)lVar2 < iVar8) {
    iVar8 = -2;
    iVar9 = lVar2 - termOffset;
    if (iVar9 != 0 && termOffset <= (int)lVar2) {
      pAVar3 = this->m_termBuffer;
      AtomicBuffer::boundsCheck(pAVar3,termOffset,4);
      *(int *)(pAVar3->m_buffer + termOffset) = -iVar9;
      local_50[0] = 0;
      local_50[1] = 0;
      puVar4 = pAVar3->m_buffer;
      puVar1 = puVar4 + (long)termOffset + 4;
      puVar1[0] = '\0';
      puVar1[1] = 0xc0;
      puVar1[2] = '\x01';
      puVar1[3] = '\0';
      *(int32_t *)(puVar4 + (long)termOffset + 8) = termOffset;
      *(HeaderWriter *)(puVar4 + (long)termOffset + 0xc) = *header;
      *(int32_t *)(puVar4 + (long)termOffset + 0x14) = termId;
      AtomicBuffer::boundsCheck(pAVar3,termOffset + 6,2);
      puVar1 = pAVar3->m_buffer;
      (puVar1 + (long)termOffset + 6)[0] = '\0';
      (puVar1 + (long)termOffset + 6)[1] = '\0';
      AtomicBuffer::boundsCheck(pAVar3,termOffset,4);
      *(int *)(pAVar3->m_buffer + termOffset) = iVar9;
    }
  }
  else {
    iVar9 = length + 0x20;
    pAVar3 = this->m_termBuffer;
    local_48 = srcOffset;
    local_38 = srcBuffer;
    AtomicBuffer::boundsCheck(pAVar3,termOffset,4);
    *(int *)(pAVar3->m_buffer + termOffset) = -0x20 - length;
    local_50[0] = 0;
    local_50[1] = 0;
    puVar4 = pAVar3->m_buffer;
    puVar1 = puVar4 + (long)termOffset + 4;
    puVar1[0] = '\0';
    puVar1[1] = 0xc0;
    puVar1[2] = '\x01';
    puVar1[3] = '\0';
    *(int32_t *)(puVar4 + (long)termOffset + 8) = termOffset;
    *(HeaderWriter *)(puVar4 + (long)termOffset + 0xc) = *header;
    *(int *)(puVar4 + (long)termOffset + 0x14) = (int)local_40;
    pAVar3 = this->m_termBuffer;
    length_00 = (size_t)length;
    AtomicBuffer::boundsCheck(pAVar3,termOffset + 0x20,length_00);
    pAVar6 = local_38;
    iVar5 = local_48;
    AtomicBuffer::boundsCheck(local_38,local_48,length_00);
    memcpy(pAVar3->m_buffer + (long)termOffset + 0x20,pAVar6->m_buffer + iVar5,length_00);
    local_50[0] = termOffset;
    local_44 = iVar9;
    if ((reservedValueSupplier->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    lVar7 = (*reservedValueSupplier->_M_invoker)
                      ((_Any_data *)reservedValueSupplier,this->m_termBuffer,local_50,&local_44);
    pAVar3 = this->m_termBuffer;
    AtomicBuffer::boundsCheck(pAVar3,termOffset + 0x18,8);
    *(long *)(pAVar3->m_buffer + (long)termOffset + 0x18) = lVar7;
    pAVar3 = this->m_termBuffer;
    AtomicBuffer::boundsCheck(pAVar3,termOffset,4);
    *(int *)(pAVar3->m_buffer + termOffset) = iVar9;
  }
  return iVar8;
}

Assistant:

inline std::int32_t appendUnfragmentedMessage(
        std::int32_t termId,
        std::int32_t termOffset,
        const HeaderWriter& header,
        const AtomicBuffer& srcBuffer,
        util::index_t srcOffset,
        util::index_t length,
        const on_reserved_value_supplier_t& reservedValueSupplier)
    {
        const util::index_t frameLength = length + DataFrameHeader::LENGTH;
        const util::index_t alignedLength = util::BitUtil::align(frameLength, FrameDescriptor::FRAME_ALIGNMENT);

        const std::int32_t termLength = m_termBuffer.capacity();

        std::int32_t resultingOffset = termOffset + alignedLength;
        putRawTailOrdered(termId, resultingOffset);

        if (resultingOffset > termLength)
        {
            resultingOffset = handleEndOfLogCondition(m_termBuffer, termId, termOffset, header, termLength);
        }
        else
        {
            header.write(m_termBuffer, termOffset, frameLength, termId);
            m_termBuffer.putBytes(termOffset + DataFrameHeader::LENGTH, srcBuffer, srcOffset, length);

            const std::int64_t reservedValue = reservedValueSupplier(m_termBuffer, termOffset, frameLength);
            m_termBuffer.putInt64(termOffset + DataFrameHeader::RESERVED_VALUE_FIELD_OFFSET, reservedValue);

            FrameDescriptor::frameLengthOrdered(m_termBuffer, termOffset, frameLength);
        }

        return resultingOffset;
    }